

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O1

void Hop_ManStop(Hop_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  long lVar2;
  long lVar3;
  int level;
  Hop_Man_t *pHVar4;
  
  if ((p->pConst1->field_0x20 & 0x30) != 0) {
    __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                  ,0x5a,"void Hop_ManStop(Hop_Man_t *)");
  }
  lVar2 = (long)p->vPis->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      if ((*(byte *)((long)p->vPis->pArray[lVar3] + 0x20) & 0x30) != 0) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                      ,0x5c,"void Hop_ManStop(Hop_Man_t *)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  lVar2 = (long)p->vPos->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      if ((*(byte *)((long)p->vPos->pArray[lVar3] + 0x20) & 0x30) != 0) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                      ,0x5e,"void Hop_ManStop(Hop_Man_t *)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  if (0 < (long)p->nTableSize) {
    lVar2 = 0;
    do {
      if ((p->pTable[lVar2] != (Hop_Obj_t *)0x0) && ((p->pTable[lVar2]->field_0x20 & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopMan.c"
                      ,0x60,"void Hop_ManStop(Hop_Man_t *)");
      }
      lVar2 = lVar2 + 1;
    } while (p->nTableSize != lVar2);
  }
  pHVar4 = p;
  if (p->time1 != 0) {
    Abc_Print((int)p,"%s =","time1");
    Abc_Print((int)pHVar4,"%9.2f sec\n",(double)p->time1 / 1000000.0);
  }
  level = (int)pHVar4;
  if (p->time2 != 0) {
    Abc_Print(level,"%s =","time2");
    Abc_Print(level,"%9.2f sec\n",(double)p->time2 / 1000000.0);
  }
  if (p->vChunks != (Vec_Ptr_t *)0x0) {
    Hop_ManStopMemory(p);
  }
  pVVar1 = p->vPis;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vPos;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vObjs;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  if (p->pTable != (Hop_Obj_t **)0x0) {
    free(p->pTable);
    p->pTable = (Hop_Obj_t **)0x0;
  }
  free(p);
  return;
}

Assistant:

void Hop_ManStop( Hop_Man_t * p )
{
    Hop_Obj_t * pObj;
    int i;
    // make sure the nodes have clean marks
    pObj = Hop_ManConst1(p);
    assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachPi( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachPo( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    Hop_ManForEachNode( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // print time
    if ( p->time1 ) { ABC_PRT( "time1", p->time1 ); }
    if ( p->time2 ) { ABC_PRT( "time2", p->time2 ); }
//    Hop_TableProfile( p );
    if ( p->vChunks )  Hop_ManStopMemory( p );
    if ( p->vPis )     Vec_PtrFree( p->vPis );
    if ( p->vPos )     Vec_PtrFree( p->vPos );
    if ( p->vObjs )    Vec_PtrFree( p->vObjs );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}